

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O3

bool boundScaleOk(vector<double,_std::allocator<double>_> *lower,
                 vector<double,_std::allocator<double>_> *upper,HighsInt bound_scale,
                 double infinite_bound)

{
  double dVar1;
  pointer pdVar2;
  uint uVar3;
  ulong uVar4;
  double dVar5;
  
  if (bound_scale != 0) {
    dVar5 = ldexp(1.0,bound_scale);
    pdVar2 = (lower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = (uint)((ulong)((long)(lower->super__Vector_base<double,_std::allocator<double>_>).
                                 _M_impl.super__Vector_impl_data._M_finish - (long)pdVar2) >> 3);
    if (0 < (int)uVar3) {
      uVar4 = 0;
      do {
        dVar1 = pdVar2[uVar4];
        if (((dVar1 != -INFINITY) && (infinite_bound < ABS(dVar1 * dVar5))) ||
           ((dVar1 = (upper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar4], dVar1 != INFINITY &&
            (infinite_bound < ABS(dVar1 * dVar5))))) {
          return false;
        }
        uVar4 = uVar4 + 1;
      } while ((uVar3 & 0x7fffffff) != uVar4);
    }
  }
  return true;
}

Assistant:

bool boundScaleOk(const vector<double>& lower, const vector<double>& upper,
                  const HighsInt bound_scale, const double infinite_bound) {
  if (!bound_scale) return true;
  double bound_scale_value = std::pow(2, bound_scale);
  for (HighsInt iCol = 0; iCol < HighsInt(lower.size()); iCol++) {
    if (lower[iCol] > -kHighsInf &&
        std::abs(lower[iCol] * bound_scale_value) > infinite_bound)
      return false;
    if (upper[iCol] < kHighsInf &&
        std::abs(upper[iCol] * bound_scale_value) > infinite_bound)
      return false;
  }
  return true;
}